

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O3

ma_vec3f ma_vec3f_neg(ma_vec3f a)

{
  ma_vec3f mVar1;
  
  mVar1._0_8_ = a._0_8_ ^ 0x8000000080000000;
  mVar1.z = -a.z;
  return mVar1;
}

Assistant:

MA_API ma_vec3f ma_vec3f_neg(ma_vec3f a)
{
    return ma_vec3f_init_3f(
        -a.x,
        -a.y,
        -a.z
    );
}